

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O0

Orientations __thiscall QGridLayout::expandingDirections(QGridLayout *this)

{
  QFlagsStorageHelper<Qt::Orientation,_4> QVar1;
  QGridLayoutPrivate *this_00;
  QGridLayoutPrivate *in_RDI;
  QGridLayoutPrivate *d;
  QGridLayoutPrivate *pQVar2;
  
  this_00 = d_func((QGridLayout *)0x33640c);
  pQVar2 = this_00;
  horizontalSpacing((QGridLayout *)this_00);
  verticalSpacing((QGridLayout *)this_00);
  QVar1.super_QFlagsStorage<Qt::Orientation>.i =
       (QFlagsStorage<Qt::Orientation>)
       QGridLayoutPrivate::expandingDirections(in_RDI,(int)((ulong)pQVar2 >> 0x20),(int)pQVar2);
  return (QFlagsStorageHelper<Qt::Orientation,_4>)
         (QFlagsStorageHelper<Qt::Orientation,_4>)QVar1.super_QFlagsStorage<Qt::Orientation>.i;
}

Assistant:

Qt::Orientations QGridLayout::expandingDirections() const
{
    Q_D(const QGridLayout);
    return d->expandingDirections(horizontalSpacing(), verticalSpacing());
}